

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  int iVar1;
  seqStore_t *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  U32 UVar6;
  size_t sVar7;
  uint uVar8;
  U32 UVar9;
  BYTE *pBVar10;
  size_t sVar11;
  BYTE *ip;
  ulong uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  seqDef *psVar16;
  BYTE *pBVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  size_t offsetFound;
  U32 local_c4;
  size_t local_c0;
  size_t local_a8;
  int *local_a0;
  ulong local_98;
  U32 local_8c;
  int *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  ZSTD_compressionParameters *local_58;
  ZSTD_matchState_t *local_50;
  seqStore_t *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  pBVar13 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  local_98 = (ulong)uVar5;
  local_60 = (ulong)(ms->window).lowLimit;
  local_80 = pBVar13 + local_98;
  local_c4 = *rep;
  UVar9 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  piVar19 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar19 < local_88) {
    local_68 = local_78 + local_98;
    local_38 = local_78 + local_60;
    iVar4 = uVar5 - 1;
    local_70 = pBVar13;
    local_58 = cParams;
    local_50 = ms;
    local_48 = seqStore;
    do {
      local_a0 = (int *)((long)piVar19 + 1);
      iVar20 = (int)piVar19 - (int)pBVar13;
      uVar5 = (iVar20 - local_c4) + 1;
      pBVar10 = pBVar13;
      if (uVar5 < (uint)local_98) {
        pBVar10 = local_78;
      }
      local_8c = UVar9;
      if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) && (*local_a0 == *(int *)(pBVar10 + uVar5)))
      {
        pBVar14 = iEnd;
        if (uVar5 < (uint)local_98) {
          pBVar14 = local_68;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 5),(BYTE *)((long)(pBVar10 + uVar5) + 4),iEnd,
                           pBVar14,local_80);
        uVar12 = sVar7 + 4;
      }
      else {
        uVar12 = 0;
      }
      local_a8 = 99999999;
      uVar5 = local_58->searchLength - 5;
      UVar9 = 4;
      if (uVar5 < 3) {
        UVar9 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
      }
      sVar7 = ZSTD_BtFindBestMatch_extDict(local_50,local_58,(BYTE *)piVar19,iEnd,&local_a8,UVar9);
      local_c0 = uVar12;
      if (uVar12 < sVar7) {
        local_c0 = sVar7;
      }
      if (local_c0 < 4) {
        piVar19 = (int *)((long)piVar19 + ((long)piVar19 - (long)src >> 8) + 1);
        UVar9 = local_8c;
      }
      else {
        piVar18 = piVar19;
        sVar11 = local_a8;
        if (sVar7 <= uVar12) {
          piVar18 = local_a0;
          sVar11 = 0;
        }
        local_a0 = piVar18;
        if (piVar19 < local_88) {
          do {
            piVar18 = (int *)((long)piVar19 + 1);
            if (sVar11 == 0) {
              sVar11 = 0;
            }
            else {
              uVar5 = (iVar20 + 1) - local_c4;
              pBVar13 = local_70;
              if (uVar5 < (uint)local_98) {
                pBVar13 = local_78;
              }
              if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) &&
                 (*piVar18 == *(int *)(pBVar13 + uVar5))) {
                pBVar10 = iEnd;
                if (uVar5 < (uint)local_98) {
                  pBVar10 = local_68;
                }
                sVar7 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar19 + 5),(BYTE *)((long)(pBVar13 + uVar5) + 4)
                                   ,iEnd,pBVar10,local_80);
                if (sVar7 < 0xfffffffffffffffc) {
                  uVar8 = (int)sVar11 + 1;
                  uVar5 = 0x1f;
                  if (uVar8 != 0) {
                    for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                    }
                  }
                  if ((int)((uVar5 ^ 0x1f) + (int)local_c0 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
                    sVar11 = 0;
                    local_c0 = sVar7 + 4;
                    local_a0 = piVar18;
                  }
                }
              }
            }
            local_a8 = 99999999;
            uVar5 = local_58->searchLength - 5;
            UVar9 = 4;
            if (uVar5 < 3) {
              UVar9 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
            }
            sVar7 = ZSTD_BtFindBestMatch_extDict
                              (local_50,local_58,(BYTE *)piVar18,iEnd,&local_a8,UVar9);
            if (sVar7 < 4) {
LAB_0016bb94:
              if (local_88 <= piVar18) break;
              piVar18 = (int *)((long)piVar19 + 2);
              if (sVar11 == 0) {
                sVar11 = 0;
              }
              else {
                uVar5 = (iVar20 + 2) - local_c4;
                pBVar13 = local_70;
                if (uVar5 < (uint)local_98) {
                  pBVar13 = local_78;
                }
                if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) &&
                   (*piVar18 == *(int *)(pBVar13 + uVar5))) {
                  pBVar10 = iEnd;
                  if (uVar5 < (uint)local_98) {
                    pBVar10 = local_68;
                  }
                  sVar7 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar19 + 6),
                                     (BYTE *)((long)(pBVar13 + uVar5) + 4),iEnd,pBVar10,local_80);
                  if (sVar7 < 0xfffffffffffffffc) {
                    uVar8 = (int)sVar11 + 1;
                    uVar5 = 0x1f;
                    if (uVar8 != 0) {
                      for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                      }
                    }
                    if ((int)((uVar5 ^ 0x1f) + (int)local_c0 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
                      sVar11 = 0;
                      local_c0 = sVar7 + 4;
                      local_a0 = piVar18;
                    }
                  }
                }
              }
              local_a8 = 99999999;
              uVar5 = local_58->searchLength - 5;
              UVar9 = 4;
              if (uVar5 < 3) {
                UVar9 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
              }
              sVar7 = ZSTD_BtFindBestMatch_extDict
                                (local_50,local_58,(BYTE *)piVar18,iEnd,&local_a8,UVar9);
              if (sVar7 < 4) break;
              uVar8 = (int)sVar11 + 1;
              uVar5 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar8 = (int)local_a8 + 1;
              iVar1 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              iVar3 = iVar20 + 2;
              if ((int)sVar7 * 4 - iVar1 <= (int)((uVar5 ^ 0x1f) + (int)local_c0 * 4 + -0x18))
              break;
            }
            else {
              uVar8 = (int)sVar11 + 1;
              uVar5 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar8 = (int)local_a8 + 1;
              iVar1 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              iVar3 = iVar20 + 1;
              if ((int)sVar7 * 4 - iVar1 <= (int)((uVar5 ^ 0x1f) + (int)local_c0 * 4 + -0x1b))
              goto LAB_0016bb94;
            }
            iVar20 = iVar3;
            local_c0 = sVar7;
            sVar11 = local_a8;
            piVar19 = piVar18;
            local_a0 = piVar18;
          } while (piVar18 < local_88);
        }
        psVar2 = local_48;
        pBVar13 = local_70;
        pBVar10 = local_78;
        piVar19 = local_a0;
        if (sVar11 == 0) {
          UVar9 = 1;
        }
        else {
          pBVar17 = (BYTE *)((long)local_a0 + (2 - (long)(local_70 + sVar11)));
          pBVar15 = local_80;
          pBVar14 = local_70;
          if ((uint)pBVar17 < (uint)local_98) {
            pBVar15 = local_38;
            pBVar14 = local_78;
          }
          if ((src < local_a0) && (uVar12 = (ulong)pBVar17 & 0xffffffff, pBVar15 < pBVar14 + uVar12)
             ) {
            pBVar14 = pBVar14 + uVar12;
            do {
              piVar18 = (int *)((long)piVar19 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar18 != *pBVar14) ||
                 (local_c0 = local_c0 + 1, piVar19 = piVar18, piVar18 <= src)) break;
            } while (pBVar15 < pBVar14);
          }
          local_8c = local_c4;
          local_c4 = (int)sVar11 - 2;
          UVar9 = (int)sVar11 + 1;
        }
        uVar12 = (long)piVar19 - (long)src;
        pBVar15 = local_48->lit;
        pBVar14 = pBVar15 + uVar12;
        do {
          *(undefined8 *)pBVar15 = *src;
          pBVar15 = pBVar15 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar15 < pBVar14);
        local_48->lit = local_48->lit + uVar12;
        if (uVar12 < 0x10000) {
          psVar16 = local_48->sequences;
        }
        else {
          local_48->longLengthID = 1;
          psVar16 = local_48->sequences;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_48->sequencesStart) >> 3);
        }
        psVar16->litLength = (U16)uVar12;
        psVar16->offset = UVar9;
        if (0xffff < local_c0 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_48->sequencesStart) >> 3);
        }
        psVar16->matchLength = (U16)(local_c0 - 3);
        local_48->sequences = psVar16 + 1;
        src = (void *)((long)piVar19 + local_c0);
        piVar19 = (int *)src;
        UVar9 = local_8c;
        UVar6 = local_8c;
        if (src <= local_88) {
          do {
            uVar8 = UVar6;
            UVar6 = local_c4;
            uVar5 = (uint)((long)src - (long)(pBVar13 + uVar8));
            pBVar14 = pBVar13;
            if (uVar5 < (uint)local_98) {
              pBVar14 = pBVar10;
            }
            piVar19 = (int *)src;
            UVar9 = uVar8;
            local_c4 = UVar6;
            if (((uVar5 <= (uint)local_60) || (iVar4 - uVar5 < 3)) ||
               (*src != *(int *)(pBVar14 + ((long)src - (long)(pBVar13 + uVar8) & 0xffffffff))))
            break;
            pBVar15 = iEnd;
            if (uVar5 < (uint)local_98) {
              pBVar15 = local_68;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),
                               (BYTE *)((long)(pBVar14 +
                                              ((long)src - (long)(pBVar13 + uVar8) & 0xffffffff)) +
                                       4),iEnd,pBVar15,local_80);
            *(undefined8 *)psVar2->lit = *src;
            psVar16 = psVar2->sequences;
            psVar16->litLength = 0;
            psVar16->offset = 1;
            if (0xffff < sVar7 + 1) {
              psVar2->longLengthID = 2;
              psVar2->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)psVar2->sequencesStart) >> 3);
            }
            psVar16->matchLength = (U16)(sVar7 + 1);
            psVar2->sequences = psVar16 + 1;
            src = (void *)((long)src + sVar7 + 4);
            piVar19 = (int *)src;
            UVar9 = UVar6;
            local_c4 = uVar8;
          } while (src <= local_88);
        }
      }
    } while (piVar19 < local_88);
  }
  *local_40 = local_c4;
  local_40[1] = UVar9;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}